

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

TwoWayPipe * kj::newTwoWayPipe(void)

{
  RefOrVoid<kj::(anonymous_namespace)::AsyncPipe> pAVar1;
  Own<kj::(anonymous_namespace)::AsyncPipe> *params;
  Own<kj::(anonymous_namespace)::AsyncPipe> *params_1;
  Own<kj::(anonymous_namespace)::TwoWayPipeEnd> *pOVar2;
  Own<kj::AsyncIoStream> *in_RDI;
  undefined1 local_80 [8];
  Own<kj::(anonymous_namespace)::TwoWayPipeEnd> end2;
  Own<kj::(anonymous_namespace)::AsyncPipe> local_60;
  undefined1 local_50 [8];
  Own<kj::(anonymous_namespace)::TwoWayPipeEnd> end1;
  undefined1 local_30 [8];
  Own<kj::(anonymous_namespace)::AsyncPipe> pipe2;
  Own<kj::(anonymous_namespace)::AsyncPipe> pipe1;
  
  refcounted<kj::(anonymous_namespace)::AsyncPipe>();
  refcounted<kj::(anonymous_namespace)::AsyncPipe>();
  pAVar1 = Own<kj::(anonymous_namespace)::AsyncPipe>::operator*
                     ((Own<kj::(anonymous_namespace)::AsyncPipe> *)&pipe2.ptr);
  addRef<kj::(anonymous_namespace)::AsyncPipe>((kj *)&local_60,pAVar1);
  pAVar1 = Own<kj::(anonymous_namespace)::AsyncPipe>::operator*
                     ((Own<kj::(anonymous_namespace)::AsyncPipe> *)local_30);
  addRef<kj::(anonymous_namespace)::AsyncPipe>((kj *)&end2.ptr,pAVar1);
  heap<kj::(anonymous_namespace)::TwoWayPipeEnd,kj::Own<kj::(anonymous_namespace)::AsyncPipe>,kj::Own<kj::(anonymous_namespace)::AsyncPipe>>
            ((kj *)local_50,&local_60,(Own<kj::(anonymous_namespace)::AsyncPipe> *)&end2.ptr);
  Own<kj::(anonymous_namespace)::AsyncPipe>::~Own
            ((Own<kj::(anonymous_namespace)::AsyncPipe> *)&end2.ptr);
  Own<kj::(anonymous_namespace)::AsyncPipe>::~Own(&local_60);
  params = mv<kj::Own<kj::(anonymous_namespace)::AsyncPipe>>
                     ((Own<kj::(anonymous_namespace)::AsyncPipe> *)local_30);
  params_1 = mv<kj::Own<kj::(anonymous_namespace)::AsyncPipe>>
                       ((Own<kj::(anonymous_namespace)::AsyncPipe> *)&pipe2.ptr);
  heap<kj::(anonymous_namespace)::TwoWayPipeEnd,kj::Own<kj::(anonymous_namespace)::AsyncPipe>,kj::Own<kj::(anonymous_namespace)::AsyncPipe>>
            ((kj *)local_80,params,params_1);
  pOVar2 = mv<kj::Own<kj::(anonymous_namespace)::TwoWayPipeEnd>>
                     ((Own<kj::(anonymous_namespace)::TwoWayPipeEnd> *)local_50);
  Own<kj::AsyncIoStream>::Own<kj::(anonymous_namespace)::TwoWayPipeEnd,void>(in_RDI,pOVar2);
  pOVar2 = mv<kj::Own<kj::(anonymous_namespace)::TwoWayPipeEnd>>
                     ((Own<kj::(anonymous_namespace)::TwoWayPipeEnd> *)local_80);
  Own<kj::AsyncIoStream>::Own<kj::(anonymous_namespace)::TwoWayPipeEnd,void>(in_RDI + 1,pOVar2);
  Own<kj::(anonymous_namespace)::TwoWayPipeEnd>::~Own
            ((Own<kj::(anonymous_namespace)::TwoWayPipeEnd> *)local_80);
  Own<kj::(anonymous_namespace)::TwoWayPipeEnd>::~Own
            ((Own<kj::(anonymous_namespace)::TwoWayPipeEnd> *)local_50);
  Own<kj::(anonymous_namespace)::AsyncPipe>::~Own
            ((Own<kj::(anonymous_namespace)::AsyncPipe> *)local_30);
  Own<kj::(anonymous_namespace)::AsyncPipe>::~Own
            ((Own<kj::(anonymous_namespace)::AsyncPipe> *)&pipe2.ptr);
  return (TwoWayPipe *)in_RDI;
}

Assistant:

TwoWayPipe newTwoWayPipe() {
  auto pipe1 = kj::refcounted<AsyncPipe>();
  auto pipe2 = kj::refcounted<AsyncPipe>();
  auto end1 = kj::heap<TwoWayPipeEnd>(kj::addRef(*pipe1), kj::addRef(*pipe2));
  auto end2 = kj::heap<TwoWayPipeEnd>(kj::mv(pipe2), kj::mv(pipe1));
  return { { kj::mv(end1), kj::mv(end2) } };
}